

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int m_select_code_option(aec_stream *strm)

{
  uint uVar1;
  internal_state *piVar2;
  uint *puVar3;
  uint8_t *puVar4;
  internal_state *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  code *pcVar9;
  internal_state *state;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  size_t i;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  
  piVar2 = strm->state;
  iVar6 = piVar2->id_len;
  uVar10 = 0xffffffff;
  if (1 < iVar6) {
    uVar11 = strm->block_size;
    iVar13 = uVar11 - piVar2->ref;
    iVar19 = piVar2->k;
    bVar21 = iVar19 == 0;
    iVar15 = iVar19 + -1;
    bVar22 = true;
    uVar14 = 0xffffffffffffffff;
    iVar7 = iVar19;
    do {
      if ((ulong)uVar11 == 0) {
        uVar18 = 0;
      }
      else {
        uVar10 = 0;
        uVar18 = 0;
        do {
          uVar18 = uVar18 + (piVar2->block[uVar10] >> ((byte)iVar7 & 0x1f));
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      uVar10 = (long)((iVar7 + 1) * iVar13) + uVar18;
      if (uVar10 < uVar14) {
        if (uVar14 != 0xffffffffffffffff) {
          bVar21 = true;
        }
        iVar19 = iVar7;
        if (bVar22) {
          if ((uVar18 < (ulong)(long)iVar13) || (piVar2->kmax <= iVar7)) {
            bVar22 = true;
            bVar17 = false;
            if (bVar21) {
              bVar21 = true;
            }
            else {
              bVar17 = true;
              bVar21 = true;
              bVar22 = false;
              iVar7 = iVar15;
            }
          }
          else {
            bVar17 = true;
            bVar22 = true;
            iVar7 = iVar7 + 1;
          }
        }
        else {
          bVar17 = iVar7 != 0 && uVar18 < (ulong)(long)iVar13;
          bVar22 = false;
          iVar7 = iVar7 - (uint)bVar17;
        }
      }
      else {
        bVar17 = false;
        uVar10 = uVar14;
        if (bVar21) {
          bVar21 = true;
        }
        else {
          bVar17 = true;
          bVar21 = true;
          bVar22 = false;
          iVar7 = iVar15;
        }
      }
      uVar14 = uVar10;
    } while (bVar17);
    piVar2->k = iVar19;
  }
  uVar14 = (ulong)strm->block_size;
  bVar22 = uVar14 != 0;
  if (uVar14 == 0) {
    uVar18 = 1;
  }
  else {
    puVar3 = piVar2->block;
    uVar18 = (ulong)puVar3[1];
    uVar18 = ((*puVar3 + uVar18 + 1) * (uVar18 + *puVar3) >> 1) + uVar18 + 2;
    bVar22 = true;
    if (uVar18 <= piVar2->uncomp_len) {
      uVar16 = 2;
      do {
        bVar22 = uVar16 < uVar14;
        if (!bVar22) break;
        uVar20 = (ulong)puVar3[uVar16 + 1];
        uVar18 = uVar18 + uVar20 + ((puVar3[uVar16] + uVar20 + 1) * (uVar20 + puVar3[uVar16]) >> 1)
                 + 1;
        uVar16 = uVar16 + 2;
      } while (uVar18 <= piVar2->uncomp_len);
    }
  }
  uVar11 = 0xffffffff;
  if (!bVar22) {
    uVar11 = (uint)uVar18;
  }
  if ((uint)uVar10 < piVar2->uncomp_len) {
    if (uVar11 <= (uint)uVar10) {
LAB_0019b6e6:
      m_encode_se(strm);
      return 1;
    }
    iVar19 = piVar2->bits;
    uVar11 = piVar2->k;
    uVar12 = uVar11 + 1;
    if (iVar19 < iVar6) {
      iVar6 = iVar6 - iVar19;
      puVar4 = piVar2->cds;
      piVar2->cds = puVar4 + 1;
      *puVar4 = *puVar4 + (char)(uVar12 >> ((byte)iVar6 & 0x3f));
      iVar19 = iVar6;
      if (8 < iVar6) {
        do {
          iVar6 = iVar19 + -8;
          puVar4 = piVar2->cds;
          piVar2->cds = puVar4 + 1;
          *puVar4 = (uint8_t)(uVar12 >> ((byte)iVar6 & 0x1f));
          bVar22 = 0x10 < iVar19;
          iVar19 = iVar6;
        } while (bVar22);
      }
      piVar2->bits = 8 - iVar6;
      *piVar2->cds = (uint8_t)(uVar12 << ((byte)(8 - iVar6) & 0x1f));
    }
    else {
      piVar2->bits = iVar19 - iVar6;
      *piVar2->cds = *piVar2->cds + (char)(uVar12 << ((byte)(iVar19 - iVar6) & 0x1f));
    }
    if (piVar2->ref != 0) {
      iVar6 = piVar2->bits;
      uVar12 = piVar2->ref_sample;
      uVar1 = strm->bits_per_sample;
      if (iVar6 < (int)uVar1) {
        iVar6 = uVar1 - iVar6;
        puVar4 = piVar2->cds;
        piVar2->cds = puVar4 + 1;
        *puVar4 = *puVar4 + (char)(uVar12 >> ((byte)iVar6 & 0x3f));
        iVar19 = iVar6;
        if (8 < iVar6) {
          do {
            iVar6 = iVar19 + -8;
            puVar4 = piVar2->cds;
            piVar2->cds = puVar4 + 1;
            *puVar4 = (uint8_t)(uVar12 >> ((byte)iVar6 & 0x1f));
            bVar22 = 0x10 < iVar19;
            iVar19 = iVar6;
          } while (bVar22);
        }
        piVar2->bits = 8 - iVar6;
        *piVar2->cds = (uint8_t)(uVar12 << ((byte)(8 - iVar6) & 0x1f));
      }
      else {
        piVar2->bits = iVar6 - uVar1;
        *piVar2->cds = *piVar2->cds + (char)(uVar12 << ((byte)(iVar6 - uVar1) & 0x1f));
      }
    }
    uVar14 = (ulong)piVar2->ref;
    piVar5 = strm->state;
    uVar10 = (ulong)*piVar5->cds << 0x38;
    uVar12 = 7 - piVar5->bits;
    if (uVar14 < strm->block_size) {
      do {
        for (uVar12 = uVar12 + (piVar5->block[uVar14] >> ((byte)uVar11 & 0x1f)) + 1; 0x3f < uVar12;
            uVar12 = uVar12 - 0x40) {
          *(ulong *)piVar5->cds =
               uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
               (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
               (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28
               | uVar10 << 0x38;
          piVar5->cds = piVar5->cds + 8;
          uVar10 = 0;
        }
        uVar10 = uVar10 | 1L << ((ulong)(byte)((byte)uVar12 ^ 0x3f) & 0x3f);
        uVar14 = uVar14 + 1;
      } while (uVar14 < strm->block_size);
    }
    *(ulong *)piVar5->cds =
         uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
         (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    piVar5->cds = piVar5->cds + (uVar12 >> 3);
    piVar5->bits = ~uVar12 & 7;
    if (uVar11 == 0) goto LAB_0019b916;
    iVar6 = piVar2->ref;
  }
  else {
    if (uVar11 < piVar2->uncomp_len) goto LAB_0019b6e6;
    uVar11 = ~(-1 << ((byte)iVar6 & 0x1f));
    iVar19 = piVar2->bits;
    if (iVar19 < iVar6) {
      iVar6 = iVar6 - iVar19;
      puVar4 = piVar2->cds;
      piVar2->cds = puVar4 + 1;
      *puVar4 = *puVar4 + (char)(uVar11 >> ((byte)iVar6 & 0x3f));
      iVar19 = iVar6;
      if (8 < iVar6) {
        do {
          iVar6 = iVar19 + -8;
          puVar4 = piVar2->cds;
          piVar2->cds = puVar4 + 1;
          *puVar4 = (uint8_t)(uVar11 >> ((byte)iVar6 & 0x1f));
          bVar22 = 0x10 < iVar19;
          iVar19 = iVar6;
        } while (bVar22);
      }
      piVar2->bits = 8 - iVar6;
      *piVar2->cds = (uint8_t)(uVar11 << ((byte)(8 - iVar6) & 0x1f));
    }
    else {
      piVar2->bits = iVar19 - iVar6;
      *piVar2->cds = *piVar2->cds + (char)(uVar11 << ((byte)(iVar19 - iVar6) & 0x1f));
    }
    if (piVar2->ref != 0) {
      *piVar2->block = piVar2->ref_sample;
    }
    uVar11 = strm->bits_per_sample;
    iVar6 = 0;
  }
  emitblock(strm,uVar11,iVar6);
LAB_0019b916:
  piVar2 = strm->state;
  if (piVar2->direct_out == 0) {
    piVar2->i = 0;
    pcVar9 = m_flush_block_resumable;
  }
  else {
    lVar8 = (long)(*(int *)&piVar2->cds - (int)strm->next_out);
    strm->next_out = strm->next_out + lVar8;
    strm->avail_out = strm->avail_out - lVar8;
    pcVar9 = m_get_block;
  }
  piVar2->mode = pcVar9;
  return 1;
}

Assistant:

static int m_select_code_option(struct aec_stream *strm)
{
    /**
       Decide which code option to use.
    */

    struct internal_state *state = strm->state;

    uint32_t split_len;
    if (state->id_len > 1)
        split_len = assess_splitting_option(strm);
    else
        split_len = UINT32_MAX;
    uint32_t se_len = assess_se_option(strm);

    if (split_len < state->uncomp_len) {
        if (split_len < se_len)
            return m_encode_splitting(strm);
        else
            return m_encode_se(strm);
    } else {
        if (state->uncomp_len <= se_len)
            return m_encode_uncomp(strm);
        else
            return m_encode_se(strm);
    }
}